

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>>::operator()
          (FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>> *this,
          FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_> *field,ParsingContext *context,
          TagSet<Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<9063U,_Fixpp::Type::String>_>
          *param_3,bool param_4,bool param_5)

{
  StreamCursor *cursor_00;
  bool bVar1;
  undefined1 local_70 [8];
  pair<const_char_*,_unsigned_long> view;
  Token valueToken;
  StreamCursor *cursor;
  bool param_6_local;
  bool param_5_local;
  TagSet<Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<9063U,_Fixpp::Type::String>_>
  *param_4_local;
  ParsingContext *context_local;
  FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_> *field_local;
  FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>_> *this_local;
  
  cursor_00 = context->cursor;
  StreamCursor::Token::Token((Token *)&view.second,cursor_00);
  bVar1 = match_until_fast('|',cursor_00);
  if (bVar1) {
    _local_70 = StreamCursor::Token::view((Token *)&view.second);
    FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>::set(field,(View *)local_70);
  }
  else {
    ParsingContext::setError(context,ParsingError,"Expected value after tag %d, got EOF",0x6e);
  }
  return;
}

Assistant:

void operator()(Field& field,
                            ParsingContext& context, TagSet&, bool, bool)
            {
                static constexpr auto Tag = Field::Tag::Id;
                auto& cursor = context.cursor;

                StreamCursor::Token valueToken(cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", Tag);

                auto view = valueToken.view();

                field.set(view);
            }